

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

void __thiscall BinHash<IPStatsRecord>::Clear(BinHash<IPStatsRecord> *this)

{
  IPStatsRecord **ppIVar1;
  IPStatsRecord *pIVar2;
  ulong uVar3;
  
  if (this->hashBin != (IPStatsRecord **)0x0) {
    if (this->tableSize != 0) {
      uVar3 = 0;
      do {
        pIVar2 = this->hashBin[uVar3];
        if (pIVar2 != (IPStatsRecord *)0x0) {
          ppIVar1 = this->hashBin + uVar3;
          do {
            *ppIVar1 = pIVar2->HashNext;
            operator_delete(pIVar2);
            ppIVar1 = this->hashBin + uVar3;
            pIVar2 = *ppIVar1;
          } while (pIVar2 != (IPStatsRecord *)0x0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->tableSize);
    }
    if (this->hashBin != (IPStatsRecord **)0x0) {
      operator_delete__(this->hashBin);
    }
    this->hashBin = (IPStatsRecord **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }